

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void readTxa<TxaHeaderPS3>(istream *stream,TxaHeader *header)

{
  bool bVar1;
  value_type_conflict4 vVar2;
  value_type_conflict3 vVar3;
  uint32_t uVar4;
  reference pvVar5;
  char *pcVar6;
  undefined1 *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  TxaChunkPS3 TVar7;
  size_t stringLength;
  TxaChunkPS3 c;
  TxaChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *__range1;
  vector<char,_std::allocator<char>_> buffer;
  TxaHeaderPS3 h;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *in_stack_ffffffffffffff08;
  istream *in_stack_ffffffffffffff10;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *this;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  uint32_le *__new_size;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string local_b0 [32];
  size_type local_90;
  TxaChunkPS3 local_78;
  reference local_68;
  TxaChunk *local_60;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_58;
  undefined1 *local_50;
  vector<TxaChunk,_std::allocator<TxaChunk>_> local_48;
  TxaHeaderPS3 local_30;
  undefined1 *local_10;
  vector<char,_std::allocator<char>_> *local_8;
  
  *in_RSI = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<TxaHeaderPS3>(in_stack_ffffffffffffff10);
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x1191b8);
  *(value_type_conflict3 *)(local_10 + 8) = vVar3;
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x1191d6);
  *(value_type_conflict3 *)(local_10 + 0xc) = vVar3;
  uVar4 = TxaHeaderPS3::getIndexSize(&local_30);
  *(uint32_t *)(local_10 + 0x10) = uVar4;
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x11921f);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::resize
            ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x11923a);
  local_50 = local_10 + 0x18;
  local_58._M_current =
       (TxaChunk *)
       std::vector<TxaChunk,_std::allocator<TxaChunk>_>::begin(in_stack_ffffffffffffff08);
  local_60 = (TxaChunk *)
             std::vector<TxaChunk,_std::allocator<TxaChunk>_>::end(in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
               operator*(&local_58);
    TVar7 = readRaw<TxaChunkPS3>((istream *)0x1192b8);
    __new_size = &local_78.entryOffset;
    local_78 = TVar7;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x1192f8);
    local_68->index = vVar2;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x119313);
    local_68->width = vVar2;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x11932f);
    local_68->height = vVar2;
    vVar3 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                   *)0x119348);
    local_68->offset = vVar3;
    vVar3 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                   *)0x119362);
    local_68->length = vVar3;
    uVar4 = TxaChunkPS3::getDecLength(&local_78);
    local_68->decodedLength = uVar4;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x11939e);
    local_90 = (ulong)vVar2 - 0x10;
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)CONCAT44(uVar4,in_stack_ffffffffffffff30),
               (size_type)__new_size);
    this = &local_48;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)this,local_90);
    *pvVar5 = '\0';
    in_stack_ffffffffffffff20 = local_8;
    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1193f2);
    std::istream::read((char *)in_stack_ffffffffffffff20,(long)pcVar6);
    in_stack_ffffffffffffff08 = &local_48;
    in_stack_ffffffffffffff10 =
         (istream *)
         std::vector<char,_std::allocator<char>_>::data
                   ((vector<char,_std::allocator<char>_> *)0x119417);
    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x119425);
    strlen(pcVar6);
    toUTF8_abi_cxx11_((char *)this,(size_t)in_stack_ffffffffffffff10);
    std::__cxx11::string::operator=((string *)&local_68->name,local_b0);
    std::__cxx11::string::~string(local_b0);
    __gnu_cxx::__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
    operator++(&local_58);
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void readTxa(std::istream& stream, TxaHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.indexed = h.indexed.value();
	header.largestDecodedChunk = h.largestDecodedChunk.value();
	header.indexSize = h.getIndexSize();
	header.chunks.resize(h.chunks.value());

	std::vector<char> buffer;

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.index = c.index.value();
		chunk.width = c.width.value();
		chunk.height = c.height.value();
		chunk.offset = c.entryOffset.value();
		chunk.length = c.entryLength.value();
		chunk.decodedLength = c.getDecLength();
		const size_t stringLength = c.headerLength.value() - sizeof(c);
		buffer.resize(stringLength + 1);
		buffer[stringLength] = 0;
		stream.read(buffer.data(), stringLength);
		chunk.name = toUTF8(buffer.data(), strlen(buffer.data()));
	}
}